

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestHandler *this,cmCTestTestProperties *it)

{
  pointer expressions;
  bool bVar1;
  
  expressions = (this->ExcludeLabelRegularExpressions).
                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((expressions !=
       (this->ExcludeLabelRegularExpressions).
       super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     ((it->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (it->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = MatchLabelsAgainstFilterRE
                      (&it->Labels,
                       (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *)expressions);
    if (bVar1) {
      it->IsInBasedOnREOptions = false;
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::CheckLabelFilterExclude(cmCTestTestProperties& it)
{
  // if not using Labels to filter then return
  if (this->ExcludeLabelRegularExpressions.empty()) {
    return;
  }
  // if there are no labels and we are excluding by labels
  // then do nothing as a no label can not be a match
  if (it.Labels.empty()) {
    return;
  }
  // if match was found, exclude the test
  if (MatchLabelsAgainstFilterRE(it.Labels,
                                 this->ExcludeLabelRegularExpressions)) {
    it.IsInBasedOnREOptions = false;
  }
}